

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# huf_decompress.c
# Opt level: O3

size_t HUF_decompress4X2_DCtx_wksp_bmi2
                 (HUF_DTable *dctx,void *dst,size_t dstSize,void *cSrc,size_t cSrcSize,
                 void *workSpace,size_t wkspSize,int bmi2)

{
  size_t sVar1;
  size_t sVar2;
  
  sVar1 = HUF_readDTableX2_wksp(dctx,cSrc,cSrcSize,workSpace,wkspSize);
  sVar2 = sVar1;
  if (sVar1 < 0xffffffffffffff89) {
    sVar2 = 0xffffffffffffffb8;
    if (sVar1 <= cSrcSize && cSrcSize - sVar1 != 0) {
      sVar2 = HUF_decompress4X2_usingDTable_internal
                        (dst,dstSize,(void *)((long)cSrc + sVar1),cSrcSize - sVar1,dctx,bmi2);
      return sVar2;
    }
  }
  return sVar2;
}

Assistant:

static size_t HUF_decompress4X2_DCtx_wksp_bmi2(HUF_DTable* dctx, void* dst, size_t dstSize,
                                   const void* cSrc, size_t cSrcSize,
                                   void* workSpace, size_t wkspSize, int bmi2)
{
    const BYTE* ip = (const BYTE*) cSrc;

    size_t hSize = HUF_readDTableX2_wksp(dctx, cSrc, cSrcSize,
                                         workSpace, wkspSize);
    if (HUF_isError(hSize)) return hSize;
    if (hSize >= cSrcSize) return ERROR(srcSize_wrong);
    ip += hSize; cSrcSize -= hSize;

    return HUF_decompress4X2_usingDTable_internal(dst, dstSize, ip, cSrcSize, dctx, bmi2);
}